

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxBinaryLogical::Resolve(FxBinaryLogical *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PString *pPVar2;
  PBool *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxBoolCast *pFVar5;
  FxExpression *pFVar6;
  FxExpression *pFVar7;
  _func_int **pp_Var8;
  PType *pPVar9;
  uint uVar10;
  FScriptPosition *pFVar11;
  uint uVar12;
  FString local_38;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar7 = this->left;
  if (pFVar7 != (FxExpression *)0x0) {
    iVar4 = (*pFVar7->_vptr_FxExpression[2])(pFVar7,ctx);
    this->left = (FxExpression *)CONCAT44(extraout_var,iVar4);
  }
  pFVar7 = this->right;
  if (pFVar7 == (FxExpression *)0x0) {
LAB_0052a545:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  iVar4 = (*pFVar7->_vptr_FxExpression[2])(pFVar7,ctx);
  pFVar7 = (FxExpression *)CONCAT44(extraout_var_00,iVar4);
  this->right = pFVar7;
  if ((pFVar7 == (FxExpression *)0x0) || (pFVar6 = this->left, pFVar6 == (FxExpression *)0x0))
  goto LAB_0052a545;
  pPVar9 = pFVar6->ValueType;
  if (pFVar6->ValueType != (PType *)TypeBool) {
    pFVar5 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar7 = this->left;
    (pFVar5->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(pFVar5->super_FxExpression).ScriptPosition,&pFVar7->ScriptPosition);
    (pFVar5->super_FxExpression).isresolved = false;
    (pFVar5->super_FxExpression).NeedResult = true;
    (pFVar5->super_FxExpression).ExprType = EFX_BoolCast;
    (pFVar5->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070b548;
    pFVar5->basex = pFVar7;
    (pFVar5->super_FxExpression).ValueType = (PType *)TypeBool;
    pFVar5->NeedValue = true;
    this->left = (FxExpression *)pFVar5;
    pFVar6 = FxBoolCast::Resolve(pFVar5,ctx);
    this->left = pFVar6;
    if (pFVar6 == (FxExpression *)0x0) goto LAB_0052a545;
    pFVar7 = this->right;
    pPVar9 = (PType *)TypeBool;
  }
  if (pFVar7->ValueType != pPVar9) {
    pFVar5 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar7 = this->right;
    (pFVar5->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(pFVar5->super_FxExpression).ScriptPosition,&pFVar7->ScriptPosition);
    (pFVar5->super_FxExpression).isresolved = false;
    (pFVar5->super_FxExpression).NeedResult = true;
    (pFVar5->super_FxExpression).ExprType = EFX_BoolCast;
    (pFVar5->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070b548;
    pFVar5->basex = pFVar7;
    (pFVar5->super_FxExpression).ValueType = (PType *)TypeBool;
    pFVar5->NeedValue = true;
    this->right = (FxExpression *)pFVar5;
    pFVar7 = FxBoolCast::Resolve(pFVar5,ctx);
    this->right = pFVar7;
    if (pFVar7 == (FxExpression *)0x0) goto LAB_0052a545;
    pFVar6 = this->left;
  }
  iVar4 = (*pFVar6->_vptr_FxExpression[3])(pFVar6);
  uVar10 = 0xffffffff;
  uVar12 = 0xffffffff;
  if ((char)iVar4 != '\0') {
    pPVar2 = (PString *)this->left[1]._vptr_FxExpression;
    pFVar11 = &this->left[1].ScriptPosition;
    if (pPVar2 == TypeString) {
      FString::AttachToOther(&local_38,&pFVar11->FileName);
    }
    else {
      local_38.Chars = (pFVar11->FileName).Chars;
    }
    BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      uVar12 = -(uint)((double)local_38.Chars != 0.0) & 1;
    }
    else if (BVar1 == '\0') {
      uVar12 = (uint)((int)local_38.Chars != 0);
    }
    else {
      uVar12 = 0;
    }
    if (pPVar2 == TypeString) {
      FString::~FString(&local_38);
    }
  }
  iVar4 = (*this->right->_vptr_FxExpression[3])();
  if ((char)iVar4 != '\0') {
    pPVar2 = (PString *)this->right[1]._vptr_FxExpression;
    pFVar11 = &this->right[1].ScriptPosition;
    if (pPVar2 == TypeString) {
      FString::AttachToOther(&local_38,&pFVar11->FileName);
    }
    else {
      local_38.Chars = (pFVar11->FileName).Chars;
    }
    BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      uVar10 = -(uint)((double)local_38.Chars != 0.0) & 1;
    }
    else if (BVar1 == '\0') {
      uVar10 = (uint)((int)local_38.Chars != 0);
    }
    else {
      uVar10 = 0;
    }
    if (pPVar2 == TypeString) {
      FString::~FString(&local_38);
    }
  }
  if (this->Operator == 0x11c) {
    if ((uVar12 == 1) || (uVar10 == 1)) goto LAB_0052a6b1;
    if (uVar10 != 0 || uVar12 != 0) {
      if (uVar12 == 0) {
LAB_0052a776:
        pp_Var8 = (this->super_FxExpression)._vptr_FxExpression;
        pFVar7 = this->right;
        this->right = (FxExpression *)0x0;
        goto LAB_0052a768;
      }
      if (uVar10 != 0) goto LAB_0052a6a4;
LAB_0052a671:
      pp_Var8 = (this->super_FxExpression)._vptr_FxExpression;
      pFVar7 = this->left;
      this->left = (FxExpression *)0x0;
      goto LAB_0052a768;
    }
LAB_0052a70a:
    pFVar7 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar7->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&pFVar7->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
    pFVar7->NeedResult = true;
    pFVar7->ExprType = EFX_Constant;
    pFVar7->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
    pPVar3 = TypeBool;
    pFVar7[1]._vptr_FxExpression = (_func_int **)TypeBool;
    pFVar7->ValueType = (PType *)pPVar3;
    *(undefined4 *)&pFVar7[1].ScriptPosition.FileName.Chars = 0;
  }
  else {
    if (this->Operator != 0x11b) {
LAB_0052a6a4:
      Flatten(this);
      return &this->super_FxExpression;
    }
    if ((uVar12 != 0) && (uVar10 != 0)) {
      if ((uVar12 == 1) && (uVar10 == 1)) goto LAB_0052a70a;
      if (uVar12 == 1) goto LAB_0052a776;
      if (uVar10 != 1) goto LAB_0052a6a4;
      goto LAB_0052a671;
    }
LAB_0052a6b1:
    pFVar7 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar7->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&pFVar7->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
    pFVar7->NeedResult = true;
    pFVar7->ExprType = EFX_Constant;
    pFVar7->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
    pPVar3 = TypeBool;
    pFVar7[1]._vptr_FxExpression = (_func_int **)TypeBool;
    pFVar7->ValueType = (PType *)pPVar3;
    *(undefined4 *)&pFVar7[1].ScriptPosition.FileName.Chars = 1;
  }
  pFVar7->isresolved = true;
  pp_Var8 = (this->super_FxExpression)._vptr_FxExpression;
LAB_0052a768:
  (*pp_Var8[1])(this);
  return pFVar7;
}

Assistant:

FxExpression *FxBinaryLogical::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	ABORT(right && left);

	if (left->ValueType != TypeBool)
	{
		left = new FxBoolCast(left);
		SAFE_RESOLVE(left, ctx);
	}
	if (right->ValueType != TypeBool)
	{
		right = new FxBoolCast(right);
		SAFE_RESOLVE(right, ctx);
	}

	int b_left=-1, b_right=-1;
	if (left->isConstant()) b_left = static_cast<FxConstant *>(left)->GetValue().GetBool();
	if (right->isConstant()) b_right = static_cast<FxConstant *>(right)->GetValue().GetBool();

	// Do some optimizations. This will throw out all sub-expressions that are not
	// needed to retrieve the final result.
	if (Operator == TK_AndAnd)
	{
		if (b_left==0 || b_right==0)
		{
			FxExpression *x = new FxConstant(true, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==1 && b_right==1)
		{
			FxExpression *x = new FxConstant(false, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==1)
		{
			FxExpression *x = right;
			right=nullptr;
			delete this;
			return x;
		}
		else if (b_right==1)
		{
			FxExpression *x = left;
			left=nullptr;
			delete this;
			return x;
		}
	}
	else if (Operator == TK_OrOr)
	{
		if (b_left==1 || b_right==1)
		{
			FxExpression *x = new FxConstant(true, ScriptPosition);
			delete this;
			return x;
		}
		if (b_left==0 && b_right==0)
		{
			FxExpression *x = new FxConstant(false, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==0)
		{
			FxExpression *x = right;
			right=nullptr;
			delete this;
			return x;
		}
		else if (b_right==0)
		{
			FxExpression *x = left;
			left=nullptr;
			delete this;
			return x;
		}
	}
	Flatten();
	return this;
}